

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutils.c
# Opt level: O2

int luaopen_lutils(lua_State *L)

{
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xb);
  luaL_setfuncs(L,lutils_functions,0);
  luaL_newmetatable(L,"luv_buffer_t");
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0xf);
  luaL_setfuncs(L,luv_buffer_functions,0);
  lua_setfield(L,-2,"__index");
  lua_pushcclosure(L,luv_buffer_close,0);
  lua_setfield(L,-2,"__gc");
  lua_pushcclosure(L,luv_buffer_tostring,0);
  lua_setfield(L,-2,"__tostring");
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUALIB_API int luaopen_lutils(lua_State *L) {

  luaL_newlib(L, lutils_functions);

  luv_buffer_init(L);

  return 1;
}